

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

void sigmund_npts(t_sigmund *x,t_floatarg f)

{
  uint uVar1;
  uint uVar2;
  t_sample *ptVar3;
  uint n;
  char *fmt;
  
  uVar1 = x->x_npts;
  n = (uint)f;
  if ((int)n < 0x80) {
    fmt = "sigmund~: minimum points %d";
    n = 0x80;
  }
  else {
    if (n < 0x400001) goto LAB_001a1e4d;
    fmt = "sigmund~: maximum points %d";
    n = 0x400000;
  }
  post(fmt);
LAB_001a1e4d:
  uVar2 = sigmund_ilog2(n);
  uVar2 = 1 << ((byte)uVar2 & 0x1f);
  if (n != uVar2) {
    post("sigmund~: adjusting analysis size to %d points");
    n = uVar2;
  }
  if (n != uVar1) {
    x->x_infill = 0;
    x->x_countdown = 0;
  }
  if (x->x_mode == 1) {
    if (x->x_inbuf == (t_sample *)0x0) {
      ptVar3 = (t_sample *)getbytes((long)(int)n << 2);
      x->x_inbuf = ptVar3;
      memset(ptVar3,0,(long)(int)n << 2);
    }
    else {
      ptVar3 = (t_sample *)resizebytes(x->x_inbuf,(long)(int)uVar1 << 2,(long)(int)n << 2);
      x->x_inbuf = ptVar3;
    }
  }
  else {
    x->x_inbuf = (t_sample *)0x0;
  }
  x->x_npts = n;
  return;
}

Assistant:

static void sigmund_npts(t_sigmund *x, t_floatarg f)
{
    int nwas = x->x_npts, npts = f;
        /* check parameter ranges */
    if (npts < NPOINTS_MIN)
        post("sigmund~: minimum points %d", NPOINTS_MIN),
            npts = NPOINTS_MIN;
    if (npts > NPOINTS_MAX)
        post("sigmund~: maximum points %d", NPOINTS_MAX),
            npts = NPOINTS_MAX;

    if (npts != (1 << sigmund_ilog2(npts)))
        post("sigmund~: adjusting analysis size to %d points",
            (npts = (1 << sigmund_ilog2(npts))));
    if (npts != nwas)
        x->x_countdown = x->x_infill  = 0;
    if (x->x_mode == MODE_STREAM)
    {
        if (x->x_inbuf)
        {
            x->x_inbuf = (t_sample *)t_resizebytes(x->x_inbuf,
                sizeof(*x->x_inbuf) * nwas, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)t_resizebytes(x->x_inbuf2,
                sizeof(*x->x_inbuf2) * nwas, sizeof(*x->x_inbuf2) * npts);
#endif
        }
        else
        {
            x->x_inbuf = (t_sample *)getbytes(sizeof(*x->x_inbuf) * npts);
            memset((char *)(x->x_inbuf), 0, sizeof(*x->x_inbuf) * npts);
#ifdef MSP
            x->x_inbuf2 = (t_sample *)getbytes(sizeof(*x->x_inbuf2) * npts);
            memset((char *)(x->x_inbuf2), 0, sizeof(*x->x_inbuf2) * npts);
#endif
        }
    }
    else x->x_inbuf = 0;
    x->x_npts = npts;
}